

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

U32 ZSTD_btGetAllMatches_noDict_3
              (ZSTD_match_t *matches,ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip,
              BYTE *iHighLimit,U32 *rep,U32 ll0,U32 lengthToBeat)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  uint uVar4;
  ulong *__s2;
  U32 UVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint *puVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong *puVar17;
  uint uVar18;
  ulong uVar19;
  ulong *puVar20;
  ulong *puVar21;
  ulong uVar22;
  bool bVar23;
  uint uVar24;
  ulong *puVar25;
  BYTE *pBVar26;
  uint uVar27;
  bool bVar28;
  bool bVar29;
  BYTE *pInLoopLimit;
  uint local_f0;
  U32 local_ec;
  ulong local_e8;
  uint local_d8;
  uint local_b0;
  uint *local_a8;
  uint *local_a0;
  uint local_64;
  BYTE *local_60;
  ulong *local_58;
  U32 *local_50;
  U32 *local_48;
  ulong *local_40;
  U32 *local_38;
  
  if (3 < (ms->cParams).minMatch) {
    __assert_fail("BOUNDED(3, ms->cParams.minMatch, 6) == mls",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x33f,
                  "U32 ZSTD_btGetAllMatches_internal(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *, const BYTE *const, const U32 *, const U32, const U32, const ZSTD_dictMode_e, const U32)"
                 );
  }
  pBVar26 = (ms->window).base;
  uVar19 = (ulong)ms->nextToUpdate;
  UVar5 = 0;
  if (pBVar26 + uVar19 <= ip) {
    local_58 = (ulong *)ip;
    local_50 = nextToUpdate3;
    while( true ) {
      __s2 = local_58;
      uVar24 = (uint)uVar19;
      uVar10 = (uint)((long)ip - (long)pBVar26);
      if (uVar10 <= uVar24) break;
      UVar5 = ZSTD_insertBt1(ms,pBVar26 + uVar19,iHighLimit,uVar10,3,0);
      uVar19 = (ulong)(UVar5 + uVar24);
      if (UVar5 + uVar24 <= uVar24) {
        __assert_fail("idx < (U32)(idx + forward)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x236,
                      "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                     );
      }
    }
    if ((ulong)((long)ip - (long)pBVar26) >> 0x20 != 0) {
      __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x239,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    if ((ulong)((long)iHighLimit - (long)pBVar26) >> 0x20 != 0) {
      __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x23a,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    ms->nextToUpdate = uVar10;
    uVar10 = (ms->cParams).targetLength;
    uVar24 = 0xfff;
    if (uVar10 < 0xfff) {
      uVar24 = uVar10;
    }
    uVar10 = (ms->cParams).hashLog;
    if (0x20 < uVar10) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    local_60 = (ms->window).base;
    uVar27 = (int)local_58 - (int)local_60;
    uVar18 = (uint)*local_58 * -0x61c8864f >> (-(char)uVar10 & 0x1fU);
    uVar14 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    uVar10 = (ms->window).lowLimit;
    uVar9 = uVar27 - uVar14;
    local_f0 = 0;
    if (uVar27 < uVar14) {
      uVar9 = 0;
    }
    uVar12 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar6 = uVar27 - uVar12;
    if (uVar27 - uVar10 <= uVar12) {
      uVar6 = uVar10;
    }
    if (ms->loadedDictEnd != 0) {
      uVar6 = uVar10;
    }
    uVar10 = uVar6 + (uVar6 == 0);
    local_b0 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    if (1 < ll0) {
      __assert_fail("ll0 <= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x27a,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    local_48 = ms->hashTable;
    uVar12 = local_48[uVar18];
    local_38 = ms->chainTable;
    uVar4 = (ms->window).dictLimit;
    uVar19 = (ulong)((uVar14 & uVar27) * 2);
    local_a8 = local_38 + uVar19;
    local_a0 = local_38 + uVar19 + 1;
    local_d8 = uVar27 + 9;
    local_e8 = (ulong)(lengthToBeat - 1);
    puVar20 = (ulong *)((long)local_58 + 3);
    puVar1 = (ulong *)(iHighLimit + -7);
    local_40 = (ulong *)((long)local_58 + 0xb);
    puVar2 = (ulong *)(iHighLimit + -3);
    puVar3 = (ulong *)(iHighLimit + -1);
    bVar28 = true;
    uVar19 = (ulong)ll0;
    do {
      if (uVar19 == 3) {
        UVar5 = *rep - 1;
      }
      else {
        UVar5 = rep[uVar19];
      }
      if (uVar27 < uVar4) {
        __assert_fail("curr >= dictLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x281,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (UVar5 - 1 < uVar27 - uVar4) {
        uVar15 = 0;
        if ((uVar6 <= uVar27 - UVar5) &&
           (uVar15 = 0,
           ((*(uint *)((long)local_58 - (ulong)UVar5) ^ (uint)*local_58) & 0xffffff) == 0)) {
          puVar21 = (ulong *)((long)puVar20 - (ulong)UVar5);
          puVar17 = puVar20;
          if (puVar20 < puVar1) {
            uVar16 = *puVar20 ^ *puVar21;
            uVar13 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
              }
            }
            uVar13 = uVar13 >> 3 & 0x1fffffff;
            iVar7 = (int)uVar13;
            puVar17 = local_40;
            if (*puVar21 == *puVar20) {
              do {
                puVar21 = puVar21 + 1;
                if (puVar1 <= puVar17) goto LAB_0020ee87;
                uVar16 = *puVar21;
                uVar22 = *puVar17;
                uVar8 = 0;
                if ((uVar22 ^ uVar16) != 0) {
                  for (; ((uVar22 ^ uVar16) >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                  }
                }
                puVar25 = (ulong *)((uVar8 >> 3 & 0x1fffffff) + (long)puVar17);
                puVar17 = puVar17 + 1;
                if (uVar16 != uVar22) {
                  uVar13 = (long)puVar25 - (long)puVar20;
                  puVar17 = puVar25;
                }
                iVar7 = (int)uVar13;
              } while (uVar16 == uVar22);
            }
          }
          else {
LAB_0020ee87:
            if ((puVar17 < puVar2) && ((uint)*puVar21 == (uint)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 4);
              puVar21 = (ulong *)((long)puVar21 + 4);
            }
            if ((puVar17 < puVar3) && ((short)*puVar21 == (short)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 2);
              puVar21 = (ulong *)((long)puVar21 + 2);
            }
            if (puVar17 < iHighLimit) {
              puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar21 == (char)*puVar17));
            }
            iVar7 = (int)puVar17 - (int)puVar20;
          }
          uVar15 = iVar7 + 3;
        }
      }
      else {
        uVar15 = 0;
        if (uVar27 < uVar6) {
          __assert_fail("curr >= windowLow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x28d,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
      }
      uVar13 = (ulong)uVar15;
      bVar23 = true;
      if (local_e8 < uVar13) {
        uVar16 = (ulong)local_f0;
        matches[uVar16].off = ((int)uVar19 - ll0) + 1;
        local_f0 = local_f0 + 1;
        matches[uVar16].len = uVar15;
        bVar29 = (BYTE *)((long)local_58 + uVar13) != iHighLimit;
        bVar23 = bVar29 && uVar15 <= uVar24;
        local_e8 = uVar13;
        if (!bVar29 || uVar15 > uVar24) {
          local_ec = local_f0;
        }
      }
      if (!bVar23) break;
      uVar19 = uVar19 + 1;
      bVar28 = uVar19 < ll0 + 3;
    } while (uVar19 != ll0 + 3);
    UVar5 = local_ec;
    if (!bVar28) {
      if (local_e8 < 3) {
        UVar5 = ZSTD_insertAndFindFirstIndexHash3(ms,local_50,(BYTE *)local_58);
        bVar28 = true;
        if ((uVar10 <= UVar5) && (uVar27 - UVar5 < 0x40000)) {
          puVar17 = (ulong *)(local_60 + UVar5);
          puVar20 = __s2;
          if (__s2 < puVar1) {
            uVar13 = *__s2 ^ *puVar17;
            uVar19 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
              }
            }
            uVar19 = uVar19 >> 3 & 0x1fffffff;
            if (*puVar17 == *__s2) {
              do {
                puVar20 = puVar20 + 1;
                puVar17 = puVar17 + 1;
                if (puVar1 <= puVar20) goto LAB_0020f02f;
                uVar13 = *puVar20 ^ *puVar17;
                uVar19 = 0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                  }
                }
                uVar19 = (long)puVar20 + ((uVar19 >> 3 & 0x1fffffff) - (long)__s2);
              } while (*puVar17 == *puVar20);
            }
          }
          else {
LAB_0020f02f:
            if ((puVar20 < puVar2) && ((uint)*puVar17 == (uint)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 4);
              puVar17 = (ulong *)((long)puVar17 + 4);
            }
            if ((puVar20 < puVar3) && ((short)*puVar17 == (short)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 2);
              puVar17 = (ulong *)((long)puVar17 + 2);
            }
            if (puVar20 < iHighLimit) {
              puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar17 == (char)*puVar20));
            }
            uVar19 = (long)puVar20 - (long)__s2;
          }
          if (2 < uVar19) {
            if (uVar27 <= UVar5) {
              __assert_fail("curr > matchIndex3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                            ,0x2ba,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if (local_f0 != 0) {
              __assert_fail("mnum==0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                            ,699,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if (uVar27 == UVar5) {
              __assert_fail("(curr - matchIndex3)>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                            ,700,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            matches->off = (uVar27 - UVar5) + 3;
            matches->len = (U32)uVar19;
            local_f0 = 1;
            local_e8 = uVar19;
            if (uVar24 < uVar19 || (BYTE *)((long)__s2 + uVar19) == iHighLimit) {
              ms->nextToUpdate = uVar27 + 1;
              local_f0 = 1;
              bVar28 = false;
              local_ec = 1;
            }
          }
        }
        if (!bVar28) {
          return local_ec;
        }
      }
      local_48[uVar18] = uVar27;
      if (uVar10 <= uVar12) {
        uVar13 = 0;
        uVar19 = 0;
        do {
          uVar16 = uVar19;
          if (uVar13 < uVar19) {
            uVar16 = uVar13;
          }
          if (uVar27 <= uVar12) {
            __assert_fail("curr > matchIndex",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                          ,0x2cd,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          if (uVar16 + uVar12 < (ulong)uVar4) {
            __assert_fail("matchIndex+matchLength >= dictLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                          ,0x2d0,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          pBVar26 = local_60 + uVar12;
          if ((uVar4 <= uVar12) && (iVar7 = bcmp(pBVar26,__s2,uVar16), iVar7 != 0)) {
            __assert_fail("memcmp(match, ip, matchLength) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                          ,0x2d2,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          puVar20 = (ulong *)((long)__s2 + uVar16);
          puVar21 = (ulong *)(pBVar26 + uVar16);
          puVar17 = puVar20;
          if (puVar20 < puVar1) {
            uVar8 = *puVar20 ^ *puVar21;
            uVar22 = 0;
            if (uVar8 != 0) {
              for (; (uVar8 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
              }
            }
            uVar22 = uVar22 >> 3 & 0x1fffffff;
            if (*puVar21 == *puVar20) {
              do {
                puVar17 = puVar17 + 1;
                puVar21 = puVar21 + 1;
                if (puVar1 <= puVar17) goto LAB_0020f241;
                uVar8 = *puVar17 ^ *puVar21;
                uVar22 = 0;
                if (uVar8 != 0) {
                  for (; (uVar8 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = (long)puVar17 + ((uVar22 >> 3 & 0x1fffffff) - (long)puVar20);
              } while (*puVar21 == *puVar17);
            }
          }
          else {
LAB_0020f241:
            if ((puVar17 < puVar2) && ((uint)*puVar21 == (uint)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 4);
              puVar21 = (ulong *)((long)puVar21 + 4);
            }
            if ((puVar17 < puVar3) && ((short)*puVar21 == (short)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 2);
              puVar21 = (ulong *)((long)puVar21 + 2);
            }
            if (puVar17 < iHighLimit) {
              puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar21 == (char)*puVar17));
            }
            uVar22 = (long)puVar17 - (long)puVar20;
          }
          uVar22 = uVar22 + uVar16;
          if (local_e8 < uVar22) {
            if (local_d8 < uVar12 || local_d8 - uVar12 == 0) {
              __assert_fail("matchEndIdx > matchIndex",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                            ,0x2df,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if (uVar12 == uVar27) {
              __assert_fail("(curr - matchIndex)>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                            ,0x2e3,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if (local_d8 - uVar12 < uVar22) {
              local_d8 = uVar12 + (U32)uVar22;
            }
            matches[local_f0].off = (uVar27 + 3) - uVar12;
            matches[local_f0].len = (U32)uVar22;
            local_f0 = local_f0 + 1;
            local_e8 = uVar22;
            if ((BYTE *)((long)__s2 + uVar22) != iHighLimit && uVar22 < 0x1001) goto LAB_0020f314;
            bVar28 = false;
          }
          else {
LAB_0020f314:
            puVar11 = local_38 + (uVar12 & uVar14) * 2;
            if (pBVar26[uVar22] < *(byte *)((long)__s2 + uVar22)) {
              *local_a8 = uVar12;
              uVar13 = uVar22;
              if (uVar9 < uVar12) {
                puVar11 = puVar11 + 1;
                local_a8 = puVar11;
LAB_0020f374:
                uVar12 = *puVar11;
                bVar28 = true;
              }
              else {
                bVar28 = false;
                local_a8 = &local_64;
              }
            }
            else {
              *local_a0 = uVar12;
              uVar19 = uVar22;
              local_a0 = puVar11;
              if (uVar9 < uVar12) goto LAB_0020f374;
              bVar28 = false;
              local_a0 = &local_64;
            }
          }
        } while (((bVar28) && (local_b0 = local_b0 - 1, local_b0 != 0)) && (uVar10 <= uVar12));
      }
      *local_a0 = 0;
      *local_a8 = 0;
      if (0x40000000 < local_b0) {
        __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x2fd,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (local_d8 <= uVar27 + 8) {
        __assert_fail("matchEndIdx > curr+8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x324,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      ms->nextToUpdate = local_d8 - 8;
      UVar5 = local_f0;
    }
  }
  return UVar5;
}

Assistant:

GEN_ZSTD_BT_GET_ALL_MATCHES(noDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(extDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(dictMatchState)

#define ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMode)  \
    {                                            \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 3), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 4), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 5), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 6)  \
    }

static ZSTD_getAllMatchesFn
ZSTD_selectBtGetAllMatches(ZSTD_matchState_t const* ms, ZSTD_dictMode_e const dictMode)
{
    ZSTD_getAllMatchesFn const getAllMatchesFns[3][4] = {
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(noDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(extDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMatchState)
    };
    U32 const mls = BOUNDED(3, ms->cParams.minMatch, 6);
    assert((U32)dictMode < 3);
    assert(mls - 3 < 4);
    return getAllMatchesFns[(int)dictMode][mls - 3];
}

/*************************
*  LDM helper functions  *
*************************/

/* Struct containing info needed to make decision about ldm inclusion */
typedef struct {
    rawSeqStore_t seqStore;   /* External match candidates store for this block */
    U32 startPosInBlock;      /* Start position of the current match candidate */
    U32 endPosInBlock;        /* End position of the current match candidate */
    U32 offset;               /* Offset of the match candidate */
} ZSTD_optLdm_t;

/* ZSTD_optLdm_skipRawSeqStoreBytes():
 * Moves forward in @rawSeqStore by @nbBytes,
 * which will update the fields 'pos' and 'posInSequence'.
 */
static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}